

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

int flatbuffers::ToUTF8(uint32_t ucc,string *out)

{
  int iVar1;
  char cVar2;
  int i;
  int iVar3;
  
  if ((int)ucc < 0) {
    __assert_fail("!(ucc & 0x80000000)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/util.h"
                  ,500,"int flatbuffers::ToUTF8(uint32_t, std::string *)");
  }
  cVar2 = '\x06';
  iVar3 = 0;
  while( true ) {
    if (iVar3 == 6) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/util.h"
                    ,0x206,"int flatbuffers::ToUTF8(uint32_t, std::string *)");
    }
    iVar1 = iVar3;
    if (ucc >> ((iVar3 == 0) + cVar2 & 0x1fU) == 0) break;
    iVar3 = iVar3 + 1;
    cVar2 = cVar2 + '\x05';
  }
  for (; std::__cxx11::string::push_back((char)out), 0 < iVar1; iVar1 = iVar1 + -1) {
  }
  return iVar3 + 1;
}

Assistant:

inline int ToUTF8(uint32_t ucc, std::string *out) {
  FLATBUFFERS_ASSERT(!(ucc & 0x80000000));  // Top bit can't be set.
  // 6 possible encodings: http://en.wikipedia.org/wiki/UTF-8
  for (int i = 0; i < 6; i++) {
    // Max bits this encoding can represent.
    uint32_t max_bits = 6 + i * 5 + static_cast<int>(!i);
    if (ucc < (1u << max_bits)) {  // does it fit?
      // Remaining bits not encoded in the first byte, store 6 bits each
      uint32_t remain_bits = i * 6;
      // Store first byte:
      (*out) += static_cast<char>((0xFE << (max_bits - remain_bits)) |
                                  (ucc >> remain_bits));
      // Store remaining bytes:
      for (int j = i - 1; j >= 0; j--) {
        (*out) += static_cast<char>(((ucc >> (j * 6)) & 0x3F) | 0x80);
      }
      return i + 1;  // Return the number of bytes added.
    }
  }
  FLATBUFFERS_ASSERT(0);  // Impossible to arrive here.
  return -1;
}